

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenI31GetSetI31(BinaryenExpressionRef expr,BinaryenExpressionRef i31Expr)

{
  if (expr->_id != I31GetId) {
    __assert_fail("expression->is<I31Get>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xf93,"void BinaryenI31GetSetI31(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (i31Expr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = i31Expr;
    return;
  }
  __assert_fail("i31Expr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xf94,"void BinaryenI31GetSetI31(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenI31GetSetI31(BinaryenExpressionRef expr,
                          BinaryenExpressionRef i31Expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<I31Get>());
  assert(i31Expr);
  static_cast<I31Get*>(expression)->i31 = (Expression*)i31Expr;
}